

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O2

void __thiscall PseudoTopoOrder::apply(PseudoTopoOrder *this,Path *P,int u,int v)

{
  int iVar1;
  int iVar2;
  _Elt_pointer pNVar3;
  NeighborNode NVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer piVar8;
  _Elt_pointer pNVar9;
  _Elt_pointer pNVar10;
  int index;
  vector<int,_std::allocator<int>_> indexesofPbetweenuandv;
  vector<int,_std::allocator<int>_> nodesofPbetweenuandv;
  int local_78;
  int local_74;
  _Map_pointer local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar10 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pNVar9 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  local_70 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pNVar3 = (P->m_path).super__Deque_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  while (pNVar10 != pNVar3) {
    NVar4 = *pNVar10;
    local_74 = (this->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[NVar4.node];
    if (local_74 < v && u <= local_74) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_68,&local_74);
      local_78 = NVar4.node;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_48,&local_78);
    }
    pNVar10 = pNVar10 + 1;
    if (pNVar10 == pNVar9) {
      pNVar10 = local_70[1];
      local_70 = local_70 + 1;
      pNVar9 = pNVar10 + 0x40;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_68._M_impl.super__Vector_impl_data._M_start,
             local_68._M_impl.super__Vector_impl_data._M_finish);
  piVar5 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar6 = (this->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = local_48._M_impl.super__Vector_impl_data._M_start;
  for (piVar7 = local_68._M_impl.super__Vector_impl_data._M_start;
      piVar7 != local_68._M_impl.super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
    iVar1 = *piVar7;
    iVar2 = *piVar8;
    piVar5[iVar1] = iVar2;
    piVar6[iVar2] = iVar1;
    piVar8 = piVar8 + 1;
  }
  if (u < this->first_unknown) {
    this->first_unknown = u;
  }
  this->path_filled = false;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void PseudoTopoOrder::apply(const Path& P, int u, int v)
{
// 	cout << "Before applying Q, we get: " << Value() << endl;

	std::vector<int> indexesofPbetweenuandv;
	std::vector<int> nodesofPbetweenuandv;

	for (auto x : P.get_path())
	{
		int index = pto_inverse[x];

		if (u <= index && index < v)
		{
			indexesofPbetweenuandv.push_back(index);
			nodesofPbetweenuandv.push_back(x);
// 			cout << "found " << x << " at " << index << endl;
		}
	}

	sort(indexesofPbetweenuandv.begin(), indexesofPbetweenuandv.end());
	int i = 0;

	for (auto p : indexesofPbetweenuandv)
	{
		pto[p] = nodesofPbetweenuandv[i];
		pto_inverse[pto[p]] = p;
		++i;
	}

// 	AnnounceModification(indexesofPbetweenuandv[0]);
	AnnounceModification(u);
// 	cout << "After applying Q, we get: " << Value() << endl;
}